

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O2

void Pla_ManDumpBlif(Pla_Man_t *p,char *pFileName)

{
  int iVar1;
  int i;
  ulong uVar2;
  FILE *__s;
  char *pcVar3;
  Vec_Str_t *p_00;
  Vec_Int_t *p_01;
  ulong uVar4;
  uint Lit;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint Lit_00;
  uint uVar8;
  int iVar9;
  
  uVar8 = (p->vDivs).nSize;
  if (uVar8 == 0) {
    uVar8 = p->nIns;
  }
  else {
    uVar4 = 0;
    uVar2 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar2 = uVar4;
    }
    uVar8 = 0;
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      uVar8 = uVar8 + ((p->vDivs).pArray[uVar4] == 0);
    }
  }
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    pcVar3 = "Cannot open file \"%s\" for writing.\n";
  }
  else {
    fwrite("# BLIF file written via PLA package in ABC on ",0x2e,1,__s);
    pcVar3 = Extra_TimeStamp();
    fputs(pcVar3,__s);
    fwrite("\n\n",2,1,__s);
    fprintf(__s,".model %s\n",p->pName);
    fwrite(".inputs",7,1,__s);
    uVar6 = 0;
    if (0 < (int)uVar8) {
      uVar6 = uVar8;
    }
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      fprintf(__s," i%d",(ulong)uVar5);
    }
    fputc(10,__s);
    fwrite(".outputs o",10,1,__s);
    fputc(10,__s);
    fwrite(".names",6,1,__s);
    for (uVar6 = 0; (int)uVar6 < p->nIns; uVar6 = uVar6 + 1) {
      fprintf(__s," i%d",(ulong)uVar6);
    }
    fwrite(" o\n",3,1,__s);
    p_00 = Vec_StrStart(p->nIns + 1);
    for (iVar7 = 0; iVar7 < (p->vCubeLits).nSize; iVar7 = iVar7 + 1) {
      p_01 = Vec_WecEntry(&p->vCubeLits,iVar7);
      for (iVar9 = 0; iVar9 < p->nIns; iVar9 = iVar9 + 1) {
        Vec_StrWriteEntry(p_00,iVar9,'-');
      }
      for (iVar9 = 0; iVar9 < p_01->nSize; iVar9 = iVar9 + 1) {
        iVar1 = Vec_IntEntry(p_01,iVar9);
        i = Abc_Lit2Var(iVar1);
        iVar1 = Abc_LitIsCompl(iVar1);
        Vec_StrWriteEntry(p_00,i,(iVar1 == 0) + '0');
      }
      fprintf(__s,"%s 1\n",p_00->pArray);
    }
    Vec_StrFree(p_00);
    for (; (int)uVar8 < (p->vDivs).nSize; uVar8 = uVar8 + 1) {
      uVar6 = Vec_IntEntry(&p->vDivs,uVar8);
      Lit = uVar6 >> 2 & 0x3ff;
      Lit_00 = uVar6 >> 0xc & 0x3ff;
      fwrite(".names",6,1,__s);
      uVar5 = Abc_Lit2Var(Lit);
      fprintf(__s," i%d",(ulong)uVar5);
      uVar5 = Abc_Lit2Var(Lit_00);
      fprintf(__s," i%d",(ulong)uVar5);
      uVar5 = uVar6 & 3;
      if (uVar5 == 3) {
        uVar5 = Abc_Lit2Var(uVar6 >> 0x16);
        fprintf(__s," i%d",(ulong)uVar5);
        fprintf(__s," i%d\n",(ulong)uVar8);
        iVar7 = Abc_LitIsCompl(Lit_00);
        if (iVar7 != 0) {
          __assert_fail("!Abc_LitIsCompl(pLits[1])",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                        ,0x8f,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
        }
        iVar7 = Abc_LitIsCompl(uVar6 >> 0x16);
        if (iVar7 != 0) {
          __assert_fail("!Abc_LitIsCompl(pLits[2])",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                        ,0x90,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
        }
        uVar6 = Abc_LitIsCompl(Lit);
        fprintf(__s,"%d-0 1\n-11 1\n",(ulong)(uVar6 ^ 1));
      }
      else {
        fprintf(__s," i%d\n");
        if (uVar5 == 2) {
          iVar7 = Abc_LitIsCompl(Lit);
          if (iVar7 != 0) {
            __assert_fail("!Abc_LitIsCompl(pLits[0])",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                          ,0x89,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
          }
          iVar7 = Abc_LitIsCompl(Lit_00);
          if (iVar7 != 0) {
            __assert_fail("!Abc_LitIsCompl(pLits[1])",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                          ,0x8a,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
          }
          fwrite("10 1\n01 1\n",10,1,__s);
        }
        else {
          if (uVar5 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                          ,0x93,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
          }
          uVar6 = Abc_LitIsCompl(Lit);
          uVar5 = Abc_LitIsCompl(Lit_00);
          fprintf(__s,"%d%d 1\n",(ulong)(uVar6 ^ 1),(ulong)(uVar5 ^ 1));
        }
      }
    }
    fwrite(".end\n\n",6,1,__s);
    fclose(__s);
    pcVar3 = "Written file \"%s\".\n";
  }
  printf(pcVar3,pFileName);
  return;
}

Assistant:

void Pla_ManDumpBlif( Pla_Man_t * p, char * pFileName )
{
    // find the number of original variables
    int nVarsInit = Pla_ManDivNum(p) ? Vec_IntCountZero(&p->vDivs) : Pla_ManInNum(p);
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
    else
    {
        //char * pLits = "-01?";
        Vec_Str_t * vStr;
        Vec_Int_t * vCube;
        int i, k, Lit, Div;
        // comment
        fprintf( pFile, "# BLIF file written via PLA package in ABC on " );
        fprintf( pFile, "%s", Extra_TimeStamp() );
        fprintf( pFile, "\n\n" );
        // header
        fprintf( pFile, ".model %s\n", Pla_ManName(p) );
        fprintf( pFile, ".inputs" );
        for ( i = 0; i < nVarsInit; i++ )
            fprintf( pFile, " i%d", i );
        fprintf( pFile, "\n" );
        fprintf( pFile, ".outputs o" );
        fprintf( pFile, "\n" );
        // SOP
        fprintf( pFile, ".names" );
        for ( i = 0; i < Pla_ManInNum(p); i++ )
            fprintf( pFile, " i%d", i );
        fprintf( pFile, " o\n" );
        vStr = Vec_StrStart( Pla_ManInNum(p) + 1 );
        Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
        {
            for ( k = 0; k < Pla_ManInNum(p); k++ )
                Vec_StrWriteEntry( vStr, k, '-' );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit) ? '0' : '1') );
            fprintf( pFile, "%s 1\n", Vec_StrArray(vStr) );
        }
        Vec_StrFree( vStr );
        // divisors
        Vec_IntForEachEntryStart( &p->vDivs, Div, i, nVarsInit )
        {
            int pLits[3] = { (Div >> 2) & 0x3FF, (Div >> 12) & 0x3FF, (Div >> 22) & 0x3FF };
            fprintf( pFile, ".names" );
            fprintf( pFile, " i%d", Abc_Lit2Var(pLits[0]) );
            fprintf( pFile, " i%d", Abc_Lit2Var(pLits[1]) );
            if ( (Div & 3) == 3 ) // MUX
                fprintf( pFile, " i%d", Abc_Lit2Var(pLits[2]) );
            fprintf( pFile, " i%d\n", i );
            if ( (Div & 3) == 1 ) // AND
                fprintf( pFile, "%d%d 1\n", !Abc_LitIsCompl(pLits[0]), !Abc_LitIsCompl(pLits[1]) );
            else if ( (Div & 3) == 2 ) // XOR
            {
                assert( !Abc_LitIsCompl(pLits[0]) );
                assert( !Abc_LitIsCompl(pLits[1]) );
                fprintf( pFile, "10 1\n01 1\n" );
            }
            else if ( (Div & 3) == 3 ) // MUX
            {
                assert( !Abc_LitIsCompl(pLits[1]) );
                assert( !Abc_LitIsCompl(pLits[2]) );
                fprintf( pFile, "%d-0 1\n-11 1\n", !Abc_LitIsCompl(pLits[0]) );
            }
            else assert( 0 );
        }
        fprintf( pFile, ".end\n\n" );
        fclose( pFile );
        printf( "Written file \"%s\".\n", pFileName );
    }
}